

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O0

double __thiscall
ValueFunctionDecPOMDPDiscrete::CalculateV<true>(ValueFunctionDecPOMDPDiscrete *this)

{
  long in_RDI;
  PlanningUnitMADPDiscrete *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  double v_sI;
  Index sI;
  double val;
  Index in_stack_0000002c;
  Index in_stack_00000030;
  Index in_stack_00000034;
  ValueFunctionDecPOMDPDiscrete *in_stack_00000038;
  undefined4 local_14;
  undefined8 local_10;
  undefined1 extraout_var [56];
  
  local_10 = 0.0;
  for (local_14 = 0; (ulong)local_14 < *(ulong *)(in_RDI + 0x28); local_14 = local_14 + 1) {
    this_00 = (PlanningUnitMADPDiscrete *)
              CalculateVsjohRecursively<true>
                        (in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_0000002c);
    auVar2._0_8_ = PlanningUnitMADPDiscrete::GetInitialStateProbability
                             (this_00,(Index)((ulong)in_RDI >> 0x20));
    auVar2._8_56_ = extraout_var;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this_00;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_10;
    auVar1 = vfmadd213sd_fma(auVar1,auVar2._0_16_,auVar3);
    local_10 = auVar1._0_8_;
  }
  return local_10;
}

Assistant:

double ValueFunctionDecPOMDPDiscrete::CalculateV()
{
#if DEBUG_CALCV
    if(DEBUG_CALCV_CACHE)
        std::cout << "CalculateV0Recursively::creating a new value function" << std::endl;
    std::cout << "evaluating joint policy:\n"; GetJPol()->Print();
#endif

    double val = 0;
    for(Index sI = 0; sI < _m_nrS; sI++)
    {
        double v_sI=CalculateVsjohRecursively<CACHED>(sI, Globals::INITIAL_JOHI, 0);
#if DEBUG_CALCV
        std::cout << ">>>ValueFunctionDecPOMDPDiscrete::CalculateV() -"
                  << " CalculateVsjohRecursively(sI=" << sI
                  << ", INITIAL_JOHI, Cached ) = " << v_sI << std::endl;
#endif
        val +=  _m_pu->GetInitialStateProbability(sI) * v_sI;
    }
#if DEBUG_CALCV
    std::cout << "This policy's V=" << val <<std::endl;
#endif
    return val;
}